

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::ShaderAtomicCompSwapCase::iterate(ShaderAtomicCompSwapCase *this)

{
  glBindBufferFunc p_Var1;
  glBufferDataFunc p_Var2;
  glBindBufferBaseFunc p_Var3;
  glDispatchComputeFunc p_Var4;
  int iVar5;
  GLuint index;
  uint uVar6;
  uint uVar7;
  deBool dVar8;
  deUint32 dVar9;
  GLenum GVar10;
  uint uVar11;
  RenderContext *pRVar12;
  undefined4 extraout_var;
  TestError *pTVar13;
  ulong uVar14;
  reference pvVar15;
  TestLog *pTVar16;
  MessageBuilder *pMVar17;
  char *description;
  MessageBuilder local_570;
  MessageBuilder local_3f0;
  int local_26c;
  int local_268;
  int outputValue;
  int refValue;
  int localNdx;
  int groupOutput;
  int groupOffset;
  int groupNdx;
  uint uStack_24c;
  bool isOk;
  int workGroupSize_1;
  int numWorkGroups;
  void *resPtr;
  uint local_238;
  deUint32 ndx_1;
  deUint32 ndx;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_228;
  allocator<unsigned_char> local_219;
  undefined1 local_218 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bufData;
  deUint32 workGroupSize;
  deUint32 numValues;
  InterfaceVariableInfo groupVarInfo;
  undefined1 local_1a0 [4];
  deUint32 groupVarNdx;
  InterfaceVariableInfo outVarInfo;
  undefined1 local_148 [4];
  deUint32 outVarNdx;
  InterfaceVariableInfo exhVarInfo;
  undefined1 local_f0 [4];
  deUint32 exhVarNdx;
  InterfaceVariableInfo cmpVarInfo;
  undefined1 local_98 [4];
  deUint32 cmpVarNdx;
  InterfaceBlockInfo blockInfo;
  undefined1 local_38 [4];
  deUint32 blockNdx;
  Buffer inoutBuffer;
  deUint32 program;
  Functions *gl;
  ShaderAtomicCompSwapCase *this_local;
  Functions *gl_00;
  
  pRVar12 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*pRVar12->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar5);
  inoutBuffer.super_ObjectWrapper._20_4_ = glu::ShaderProgram::getProgram(this->m_program);
  pRVar12 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_38,pRVar12);
  index = (*gl_00->getProgramResourceIndex)(inoutBuffer.super_ObjectWrapper._20_4_,0x92e6,"InOut");
  glu::getProgramInterfaceBlockInfo
            ((InterfaceBlockInfo *)local_98,gl_00,inoutBuffer.super_ObjectWrapper._20_4_,0x92e6,
             index);
  cmpVarInfo._76_4_ =
       (*gl_00->getProgramResourceIndex)
                 (inoutBuffer.super_ObjectWrapper._20_4_,0x92e5,"InOut.compareValues[0]");
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)local_f0,gl_00,inoutBuffer.super_ObjectWrapper._20_4_,0x92e5,
             cmpVarInfo._76_4_);
  exhVarInfo._76_4_ =
       (*gl_00->getProgramResourceIndex)
                 (inoutBuffer.super_ObjectWrapper._20_4_,0x92e5,"InOut.exchangeValues[0]");
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)local_148,gl_00,inoutBuffer.super_ObjectWrapper._20_4_,0x92e5,
             exhVarInfo._76_4_);
  outVarInfo._76_4_ =
       (*gl_00->getProgramResourceIndex)
                 (inoutBuffer.super_ObjectWrapper._20_4_,0x92e5,"InOut.outputValues[0]");
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)local_1a0,gl_00,inoutBuffer.super_ObjectWrapper._20_4_,0x92e5,
             outVarInfo._76_4_);
  groupVarInfo._76_4_ =
       (*gl_00->getProgramResourceIndex)
                 (inoutBuffer.super_ObjectWrapper._20_4_,0x92e5,"InOut.groupValues[0]");
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)&workGroupSize,gl_00,inoutBuffer.super_ObjectWrapper._20_4_,
             0x92e5,groupVarInfo._76_4_);
  uVar6 = product<unsigned_int,3>(&this->m_workGroupSize);
  uVar7 = product<unsigned_int,3>(&this->m_numWorkGroups);
  bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = uVar6 * uVar7;
  do {
    dVar8 = ::deGetFalse();
    dVar9 = groupVarInfo.atomicCounterBufferIndex;
    if ((((dVar8 != 0) ||
         (cmpVarInfo.atomicCounterBufferIndex !=
          bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_)) ||
        (exhVarInfo.atomicCounterBufferIndex !=
         bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_)) ||
       (outVarInfo.atomicCounterBufferIndex !=
        bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_)) {
LAB_020f2da1:
      pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar13,(char *)0x0,
                 "cmpVarInfo.arraySize == numValues && exhVarInfo.arraySize == numValues && outVarInfo.arraySize == numValues && groupVarInfo.arraySize == product(m_numWorkGroups)"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                 ,0x3f4);
      __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    uVar6 = product<unsigned_int,3>(&this->m_numWorkGroups);
    if (dVar9 != uVar6) goto LAB_020f2da1;
    dVar8 = ::deGetFalse();
  } while (dVar8 != 0);
  (*gl_00->useProgram)(inoutBuffer.super_ObjectWrapper._20_4_);
  bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = product<unsigned_int,3>(&this->m_workGroupSize);
  uVar14 = (ulong)blockInfo.index;
  std::allocator<unsigned_char>::allocator(&local_219);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218,uVar14,&local_219);
  std::allocator<unsigned_char>::~allocator(&local_219);
  local_228._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218);
  _ndx = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218);
  ndx_1 = 0;
  std::
  fill<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,int>
            (local_228,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )_ndx,(int *)&ndx_1);
  for (local_238 = 0;
      local_238 <
      bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_; local_238 = local_238 + 1) {
    uVar6 = local_238 %
            (uint)bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218,0);
    *(uint *)(pvVar15 + (ulong)(cmpVarInfo.arraySize * local_238) + (ulong)cmpVarInfo.type) = uVar6;
  }
  for (resPtr._4_4_ = 0;
      resPtr._4_4_ <
      bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_; resPtr._4_4_ = resPtr._4_4_ + 1) {
    uVar6 = resPtr._4_4_ %
            (uint)bufData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218,0);
    *(uint *)(pvVar15 + (ulong)(exhVarInfo.arraySize * resPtr._4_4_) + (ulong)exhVarInfo.type) =
         uVar6 + 1;
  }
  p_Var1 = gl_00->bindBuffer;
  dVar9 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_38);
  (*p_Var1)(0x90d2,dVar9);
  p_Var2 = gl_00->bufferData;
  uVar14 = (ulong)blockInfo.index;
  pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218,0);
  (*p_Var2)(0x90d2,uVar14,pvVar15,0x88e5);
  p_Var3 = gl_00->bindBufferBase;
  dVar9 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_38);
  (*p_Var3)(0x90d2,0,dVar9);
  GVar10 = (*gl_00->getError)();
  glu::checkError(GVar10,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                  ,0x40a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218);
  p_Var4 = gl_00->dispatchCompute;
  uVar6 = tcu::Vector<unsigned_int,_3>::x(&this->m_numWorkGroups);
  uVar7 = tcu::Vector<unsigned_int,_3>::y(&this->m_numWorkGroups);
  uVar11 = tcu::Vector<unsigned_int,_3>::z(&this->m_numWorkGroups);
  (*p_Var4)(uVar6,uVar7,uVar11);
  _workGroupSize_1 = (*gl_00->mapBufferRange)(0x90d2,0,(ulong)blockInfo.index,1);
  uStack_24c = product<unsigned_int,3>(&this->m_numWorkGroups);
  groupNdx = product<unsigned_int,3>(&this->m_workGroupSize);
  groupOffset._3_1_ = 1;
  GVar10 = (*gl_00->getError)();
  glu::checkError(GVar10,"glMapBufferRange()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                  ,0x416);
  do {
    dVar8 = ::deGetFalse();
    if ((dVar8 != 0) || (_workGroupSize_1 == (void *)0x0)) {
      pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar13,(char *)0x0,"resPtr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                 ,0x417);
      __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    dVar8 = ::deGetFalse();
  } while (dVar8 != 0);
  groupOutput = 0;
  do {
    if ((int)uStack_24c <= groupOutput) {
LAB_020f36f5:
      (*gl_00->unmapBuffer)(0x90d2);
      GVar10 = (*gl_00->getError)();
      glu::checkError(GVar10,"glUnmapBuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderAtomicOpTests.cpp"
                      ,0x436);
      description = "Comparison failed";
      if ((groupOffset._3_1_ & 1) != 0) {
        description = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (byte)~groupOffset._3_1_ & QP_TEST_RESULT_FAIL,description);
      glu::InterfaceVariableInfo::~InterfaceVariableInfo((InterfaceVariableInfo *)&workGroupSize);
      glu::InterfaceVariableInfo::~InterfaceVariableInfo((InterfaceVariableInfo *)local_1a0);
      glu::InterfaceVariableInfo::~InterfaceVariableInfo((InterfaceVariableInfo *)local_148);
      glu::InterfaceVariableInfo::~InterfaceVariableInfo((InterfaceVariableInfo *)local_f0);
      glu::InterfaceBlockInfo::~InterfaceBlockInfo((InterfaceBlockInfo *)local_98);
      glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)1> *)local_38);
      return STOP;
    }
    localNdx = groupOutput * groupNdx;
    refValue = *(int *)((long)_workGroupSize_1 +
                       (long)(int)(groupOutput * groupVarInfo.arraySize) + (ulong)groupVarInfo.type)
    ;
    for (outputValue = 0; outputValue < groupNdx; outputValue = outputValue + 1) {
      local_268 = outputValue;
      local_26c = *(int *)((long)_workGroupSize_1 +
                          (long)(int)(outVarInfo.arraySize * (localNdx + outputValue)) +
                          (ulong)outVarInfo.type);
      if (local_26c != outputValue) {
        pTVar16 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_3f0,pTVar16,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar17 = tcu::MessageBuilder::operator<<(&local_3f0,(char (*) [17])"ERROR: at group ");
        pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&groupOutput);
        pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [14])", invocation ");
        pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&outputValue);
        pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [12])0x2b883c4);
        pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&local_268);
        pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [7])0x2c67b94);
        pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&local_26c);
        tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_3f0);
        groupOffset._3_1_ = 0;
        break;
      }
    }
    if (refValue != groupNdx) {
      pTVar16 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_570,pTVar16,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar17 = tcu::MessageBuilder::operator<<(&local_570,(char (*) [17])"ERROR: at group ");
      pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&groupOutput);
      pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [11])": expected");
      pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&groupNdx);
      pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [7])0x2c67b94);
      pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&refValue);
      tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_570);
      groupOffset._3_1_ = 0;
      goto LAB_020f36f5;
    }
    groupOutput = groupOutput + 1;
  } while( true );
}

Assistant:

ShaderAtomicOpCase::IterateResult ShaderAtomicCompSwapCase::iterate (void)
{
	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	const deUint32				program			= m_program->getProgram();
	const Buffer				inoutBuffer		(m_context.getRenderContext());
	const deUint32				blockNdx		= gl.getProgramResourceIndex(program, GL_SHADER_STORAGE_BLOCK, "InOut");
	const InterfaceBlockInfo	blockInfo		= getProgramInterfaceBlockInfo(gl, program, GL_SHADER_STORAGE_BLOCK, blockNdx);
	const deUint32				cmpVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.compareValues[0]");
	const InterfaceVariableInfo	cmpVarInfo		= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, cmpVarNdx);
	const deUint32				exhVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.exchangeValues[0]");
	const InterfaceVariableInfo	exhVarInfo		= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, exhVarNdx);
	const deUint32				outVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.outputValues[0]");
	const InterfaceVariableInfo	outVarInfo		= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, outVarNdx);
	const deUint32				groupVarNdx		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "InOut.groupValues[0]");
	const InterfaceVariableInfo	groupVarInfo	= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, groupVarNdx);
	const deUint32				numValues		= product(m_workGroupSize)*product(m_numWorkGroups);

	TCU_CHECK(cmpVarInfo.arraySize == numValues &&
			  exhVarInfo.arraySize == numValues &&
			  outVarInfo.arraySize == numValues &&
			  groupVarInfo.arraySize == product(m_numWorkGroups));

	gl.useProgram(program);

	// \todo [2013-09-05 pyry] Use randomized input values!

	// Setup buffer.
	{
		const deUint32	workGroupSize	= product(m_workGroupSize);
		vector<deUint8>	bufData			(blockInfo.dataSize);

		std::fill(bufData.begin(), bufData.end(), 0);

		for (deUint32 ndx = 0; ndx < numValues; ndx++)
			*(deUint32*)(&bufData[0] + cmpVarInfo.offset + cmpVarInfo.arrayStride*ndx) = ndx%workGroupSize;

		for (deUint32 ndx = 0; ndx < numValues; ndx++)
			*(deUint32*)(&bufData[0] + exhVarInfo.offset + exhVarInfo.arrayStride*ndx) = (ndx%workGroupSize)+1;

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *inoutBuffer);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockInfo.dataSize, &bufData[0], GL_STATIC_READ);
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *inoutBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
	}

	gl.dispatchCompute(m_numWorkGroups.x(), m_numWorkGroups.y(), m_numWorkGroups.z());

	// Read back and compare
	{
		const void*		resPtr			= gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, blockInfo.dataSize, GL_MAP_READ_BIT);
		const int		numWorkGroups	= (int)product(m_numWorkGroups);
		const int		workGroupSize	= (int)product(m_workGroupSize);
		bool			isOk			= true;

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");
		TCU_CHECK(resPtr);

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int	groupOffset		= groupNdx*workGroupSize;
			const int	groupOutput		= *(const deInt32*)((const deUint8*)resPtr + groupVarInfo.offset + groupNdx*groupVarInfo.arrayStride);

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const int	refValue		= localNdx;
				const int	outputValue		= *(const deInt32*)((const deUint8*)resPtr + outVarInfo.offset + outVarInfo.arrayStride*(groupOffset+localNdx));

				if (outputValue != refValue)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": expected " << refValue << ", got " << outputValue
									   << TestLog::EndMessage;
					isOk = false;
					break;
				}
			}

			if (groupOutput != workGroupSize)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ": expected" << workGroupSize << ", got " << groupOutput << TestLog::EndMessage;
				isOk = false;
				break;
			}
		}

		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Comparison failed");
	}

	return STOP;
}